

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O2

int __thiscall
CVmObjVector::get_minmax
          (CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *in_argc,vm_rcdesc *rc,
          int sense,int want_index)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  vm_val_t *this_00;
  int i;
  size_t idx;
  ulong uVar6;
  int local_74;
  vm_val_t ele;
  vm_val_t winner;
  
  if (in_argc == (uint *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = *in_argc;
  }
  if (get_minmax(unsigned_int,vm_val_t*,unsigned_int*,vm_rcdesc_const*,int,int)::desc == '\0') {
    iVar3 = __cxa_guard_acquire(&get_minmax(unsigned_int,vm_val_t*,unsigned_int*,vm_rcdesc_const*,int,int)
                                 ::desc);
    if (iVar3 != 0) {
      get_minmax::desc.min_argc_ = 0;
      get_minmax::desc.opt_argc_ = 1;
      get_minmax::desc.varargs_ = 0;
      __cxa_guard_release(&get_minmax(unsigned_int,vm_val_t*,unsigned_int*,vm_rcdesc_const*,int,int)
                           ::desc);
    }
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,in_argc,&get_minmax::desc);
  if (iVar3 == 0) {
    if (uVar5 == 0) {
      this_00 = (vm_val_t *)0x0;
    }
    else {
      this_00 = sp_ + -1;
      iVar3 = vm_val_t::is_func_ptr(this_00);
      if (iVar3 == 0) {
        err_throw(0x900);
      }
    }
    pvVar2 = sp_;
    pvVar1 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar1 = VM_OBJ;
    (pvVar2->val).obj = self;
    uVar6 = (ulong)*(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
    if (uVar6 == 0) {
      err_throw(0x902);
    }
    local_74 = 0;
    for (idx = 0; uVar6 != idx; idx = idx + 1) {
      get_element(this,idx,&ele);
      pvVar2 = sp_;
      if (this_00 != (vm_val_t *)0x0) {
        sp_ = sp_ + 1;
        pvVar2->typ = ele.typ;
        *(undefined4 *)&pvVar2->field_0x4 = ele._4_4_;
        pvVar2->val = ele.val;
        CVmRun::call_func_ptr(&G_interpreter_X,this_00,1,rc,0);
        ele.typ = r0_.typ;
        ele._4_4_ = r0_._4_4_;
        ele.val = r0_.val;
      }
      if (idx == 0) {
        winner.typ = ele.typ;
        winner._4_4_ = ele._4_4_;
        winner.val = ele.val;
        local_74 = 0;
      }
      else {
        uVar4 = vm_val_t::compare_to(&ele,&winner);
        if (0 < (int)uVar4 && 0 < sense || (int)(uVar4 & sense) < 0) {
          winner.typ = ele.typ;
          winner._4_4_ = ele._4_4_;
          winner.val = ele.val;
          local_74 = (int)idx;
        }
      }
    }
    sp_ = sp_ + -(long)(int)(uVar5 + 1);
    if (want_index == 0) {
      retval->typ = winner.typ;
      *(undefined4 *)&retval->field_0x4 = winner._4_4_;
      retval->val = winner.val;
    }
    else {
      retval->typ = VM_INT;
      (retval->val).obj = local_74 + 1;
    }
  }
  return 1;
}

Assistant:

int CVmObjVector::get_minmax(VMG_ vm_obj_id_t self, vm_val_t *retval,
                             uint *in_argc, const vm_rcdesc *rc,
                             int sense, int want_index)
{
    /* check arguments */
    uint argc = (in_argc == 0 ? 0 : *in_argc);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* make sure the 'func' argument is valid */
    const vm_val_t *cb = 0;
    if (argc >= 1)
    {
        cb = G_stk->get(0);
        if (!cb->is_func_ptr(vmg0_))
            err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* push 'self' for gc protection */
    G_stk->push()->set_obj(self);

    /* if there are no elements, this is an error */
    int cnt = get_element_count();
    if (cnt == 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* we don't have a winner yet */
    int winner_idx = 0;
    vm_val_t winner;

    /* run through the list */
    for (int i = 0 ; i < cnt ; ++i)
    {
        /* get this element */
        vm_val_t ele;
        get_element(i, &ele);

        /* if there's a callback, invoke it */
        if (cb != 0)
        {
            /* invoke the callback with the element value as the argument */
            G_stk->push(&ele);
            G_interpreter->call_func_ptr(vmg_ cb, 1, rc, 0);

            /* use the result as the comparison value */
            ele = *G_interpreter->get_r0();
        }

        /* compare it to the winner so far, and keep the lower value */
        if (i == 0)
        {
            /* it's the first element, so it's the default winner so far */
            winner_idx = i;
            winner = ele;
        }
        else
        {
            /* compare it to the winner so far */
            int cmp = ele.compare_to(vmg_ &winner);

            /* keep it if it's the min/max so far */
            if ((sense > 0 && cmp > 0) || (sense < 0 && cmp < 0))
            {
                winner_idx = i;
                winner = ele;
            }
        }
    }

    /* remove gc protection and arguments */
    G_stk->discard(argc + 1);

    /* return the winning index (note: 1-based) or value, as desired */
    if (want_index)
        retval->set_int(winner_idx + 1);
    else
        *retval = winner;
        
    /* handled */
    return TRUE;
}